

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idlist.h
# Opt level: O1

int __thiscall
soplex::IdList<soplex::SVSetBase<double>::DLPSV>::remove
          (IdList<soplex::SVSetBase<double>::DLPSV> *this,char *__filename)

{
  undefined8 uVar1;
  DLPSV *pDVar2;
  
  pDVar2 = (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last;
  if ((this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first != (DLPSV *)__filename) {
    if (pDVar2 != (DLPSV *)__filename) {
      *(DLPSV **)(*(long *)(__filename + 0x10) + 0x18) = *(DLPSV **)(__filename + 0x18);
      uVar1 = *(undefined8 *)(__filename + 0x10);
      *(undefined8 *)(*(long *)(__filename + 0x18) + 0x10) = uVar1;
      return (int)uVar1;
    }
    (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last = *(DLPSV **)(__filename + 0x18)
    ;
    return (int)pDVar2;
  }
  if (pDVar2 == (DLPSV *)__filename) {
    pDVar2 = (DLPSV *)0x0;
  }
  else {
    pDVar2 = *(DLPSV **)(__filename + 0x10);
  }
  (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_first = pDVar2;
  if (pDVar2 != (DLPSV *)0x0) {
    return (int)pDVar2;
  }
  (this->super_IsList<soplex::SVSetBase<double>::DLPSV>).the_last = (DLPSV *)0x0;
  return (int)pDVar2;
}

Assistant:

void remove(T* elem)
   {
      if(elem == first())
      {
         this->the_first = next(elem);

         if(first() == nullptr)
            this->the_last = nullptr;
      }
      else if(elem == last())
         this->the_last = elem->prev();
      else
      {
         elem->next()->prev() = elem->prev();
         elem->prev()->next() = elem->next();
      }
   }